

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O2

void __thiscall kj::BufferedInputStreamWrapper::skip(BufferedInputStreamWrapper *this,size_t bytes)

{
  ulong uVar1;
  void *__nbytes;
  ssize_t sVar2;
  void *__buf;
  
  uVar1 = (this->bufferAvailable).size_;
  if (uVar1 < bytes) {
    __buf = (void *)(bytes - uVar1);
    __nbytes = (void *)(this->buffer).size_;
    if (__nbytes < __buf) {
      (this->bufferAvailable).ptr = (uchar *)0x0;
      (this->bufferAvailable).size_ = 0;
      (*this->inner->_vptr_InputStream[3])(this->inner,__buf);
      return;
    }
    sVar2 = InputStream::read(this->inner,(int)(this->buffer).ptr,__buf,(size_t)__nbytes);
    (this->bufferAvailable).ptr = (uchar *)((long)__buf + (long)(this->buffer).ptr);
    (this->bufferAvailable).size_ = sVar2 - (long)__buf;
  }
  else {
    (this->bufferAvailable).ptr = (this->bufferAvailable).ptr + bytes;
    (this->bufferAvailable).size_ = uVar1 - bytes;
  }
  return;
}

Assistant:

void BufferedInputStreamWrapper::skip(size_t bytes) {
  if (bytes <= bufferAvailable.size()) {
    bufferAvailable = bufferAvailable.slice(bytes, bufferAvailable.size());
  } else {
    bytes -= bufferAvailable.size();
    if (bytes <= buffer.size()) {
      // Read the next buffer-full.
      size_t n = inner.read(buffer.begin(), bytes, buffer.size());
      bufferAvailable = buffer.slice(bytes, n);
    } else {
      // Forward large skip to the underlying stream.
      bufferAvailable = nullptr;
      inner.skip(bytes);
    }
  }
}